

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PortConnection * __thiscall
slang::BumpAllocator::emplace<slang::ast::PortConnection,slang::ast::InterfacePortSymbol_const&>
          (BumpAllocator *this,InterfacePortSymbol *args)

{
  PortConnection *this_00;
  Symbol *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  this_00 = (PortConnection *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  ast::PortConnection::PortConnection(this_00,in_RSI);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }